

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int cmf4kf_(int *lot,int *ido,int *l1,int *na,double *cc,int *im1,int *in1,double *ch,int *im2,
           int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  uint uVar40;
  long lVar41;
  long lVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  int local_144;
  int local_c8;
  int local_c4;
  
  uVar4 = *ido;
  uVar29 = (ulong)uVar4;
  iVar31 = uVar4 * 4;
  iVar5 = *in1;
  uVar6 = *l1;
  uVar25 = (ulong)uVar6;
  uVar40 = (uVar4 + 1) * uVar6;
  iVar1 = ~uVar40 * iVar5 * 2 + -3;
  iVar7 = *in2;
  uVar11 = uVar6 * 5;
  iVar2 = ~uVar11 * iVar7 * 2 + -3;
  iVar8 = *im1;
  lVar27 = (long)iVar8;
  lVar42 = ((long)*lot + -1) * lVar27;
  iVar10 = (int)lVar42;
  iVar35 = iVar10 + 1;
  iVar9 = *im2;
  if ((int)uVar4 < 2) {
    dVar43 = 1.0 / (double)(int)(uVar6 * 4);
    if (*na == 1) {
      if (0 < (int)uVar6) {
        bVar17 = -1 < iVar10;
        if (iVar8 < 0) {
          bVar17 = iVar10 < 1;
        }
        iVar18 = (uVar40 + 1) * iVar5 * 2;
        iVar37 = ((uVar4 * 3 + 1) * uVar6 + 1) * iVar5 * 2;
        iVar3 = ((uVar4 * 2 + 1) * uVar6 + 1) * iVar5 * 2;
        iVar31 = ((iVar31 + 1) * uVar6 + 1) * iVar5 * 2;
        iVar12 = (uVar6 * 8 + 1) * iVar7 * 2;
        iVar13 = (uVar6 * 6 + 1) * iVar7 * 2;
        iVar14 = (uVar6 * 7 + 1) * iVar7 * 2;
        iVar15 = (uVar11 + 1) * iVar7 * 2;
        lVar42 = 1;
        iVar24 = 0;
        iVar23 = 0;
        do {
          lVar20 = lVar27 + 1;
          iVar22 = iVar23;
          iVar26 = iVar24;
          if (bVar17) {
            do {
              dVar44 = cc[(long)iVar1 + (long)(iVar18 + 2 + iVar22) + 2] -
                       cc[(long)iVar1 + (long)(iVar37 + 2 + iVar22) + 2];
              dVar45 = cc[(long)iVar1 + (long)(iVar18 + 2 + iVar22) + 2] +
                       cc[(long)iVar1 + (long)(iVar37 + 2 + iVar22) + 2];
              dVar46 = cc[(long)iVar1 + (long)(iVar3 + 2 + iVar22) + 2] -
                       cc[(long)iVar1 + (long)(iVar31 + 2 + iVar22) + 2];
              dVar49 = cc[(long)iVar1 + (long)(iVar3 + 2 + iVar22) + 2] +
                       cc[(long)iVar1 + (long)(iVar31 + 2 + iVar22) + 2];
              dVar48 = cc[(long)iVar1 + (long)(iVar18 + 3 + iVar22)] -
                       cc[(long)iVar1 + (long)(iVar37 + 3 + iVar22)];
              dVar50 = cc[(long)iVar1 + (long)(iVar18 + 3 + iVar22)] +
                       cc[(long)iVar1 + (long)(iVar37 + 3 + iVar22)];
              dVar47 = cc[(long)iVar1 + (long)(iVar31 + 3 + iVar22)] -
                       cc[(long)iVar1 + (long)(iVar3 + 3 + iVar22)];
              dVar51 = cc[(long)iVar1 + (long)(iVar31 + 3 + iVar22)] +
                       cc[(long)iVar1 + (long)(iVar3 + 3 + iVar22)];
              ch[(long)iVar2 + (long)(iVar15 + 3 + iVar26)] = (dVar50 + dVar51) * dVar43;
              ch[(long)iVar2 + (long)(iVar14 + 3 + iVar26)] = (dVar50 - dVar51) * dVar43;
              ch[(long)iVar2 + (long)(iVar15 + 2 + iVar26) + 2] = (dVar45 + dVar49) * dVar43;
              ch[(long)iVar2 + (long)(iVar14 + 2 + iVar26) + 2] = (dVar45 - dVar49) * dVar43;
              ch[(long)iVar2 + (long)(iVar13 + 3 + iVar26)] = (dVar46 + dVar48) * dVar43;
              ch[(long)iVar2 + (long)(iVar12 + 3 + iVar26)] = (dVar48 - dVar46) * dVar43;
              ch[(long)iVar2 + (long)(iVar13 + 2 + iVar26) + 2] = (dVar44 + dVar47) * dVar43;
              ch[(long)iVar2 + (long)(iVar12 + 2 + iVar26) + 2] = (dVar44 - dVar47) * dVar43;
              bVar16 = lVar20 <= iVar35;
              if (iVar8 < 0) {
                bVar16 = iVar10 < lVar20;
              }
              lVar20 = lVar20 + lVar27;
              iVar22 = iVar22 + iVar8 * 2;
              iVar26 = iVar26 + iVar9 * 2;
            } while (bVar16);
          }
          lVar42 = lVar42 + 1;
          iVar23 = iVar23 + iVar5 * 2;
          iVar24 = iVar24 + iVar7 * 2;
        } while (lVar42 != uVar25 + 1);
      }
    }
    else if (0 < (int)uVar6) {
      bVar17 = -1 < iVar10;
      if (iVar8 < 0) {
        bVar17 = iVar10 < 1;
      }
      iVar2 = (uVar40 + 1) * iVar5 * 2;
      iVar7 = ((uVar4 * 3 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar9 = ((uVar4 * 2 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar31 = ((iVar31 + 1) * uVar6 + 1) * iVar5 * 2;
      lVar42 = 1;
      iVar18 = 0;
      do {
        lVar20 = lVar27 + 1;
        iVar37 = iVar18;
        if (bVar17) {
          do {
            lVar34 = (long)(iVar2 + iVar37 + 2);
            dVar44 = cc[(long)iVar1 + lVar34 + 2];
            lVar36 = (long)(iVar7 + 2 + iVar37);
            dVar45 = cc[(long)iVar1 + lVar36 + 2];
            lVar28 = (long)(iVar9 + 2 + iVar37);
            dVar46 = cc[(long)iVar1 + lVar28 + 2];
            lVar39 = (long)(iVar31 + 2 + iVar37);
            dVar47 = cc[(long)iVar1 + lVar39 + 2];
            lVar38 = (long)(iVar2 + 3 + iVar37);
            dVar48 = cc[iVar1 + lVar38];
            lVar33 = (long)(iVar7 + 3 + iVar37);
            dVar49 = cc[iVar1 + lVar33];
            dVar52 = dVar48 + dVar49;
            lVar30 = (long)(iVar31 + 3 + iVar37);
            dVar50 = cc[iVar1 + lVar30];
            lVar41 = (long)(iVar9 + 3 + iVar37);
            dVar51 = cc[iVar1 + lVar41];
            dVar53 = dVar50 + dVar51;
            cc[iVar1 + lVar38] = (dVar52 + dVar53) * dVar43;
            cc[iVar1 + lVar33] = (dVar52 - dVar53) * dVar43;
            dVar52 = dVar44 + dVar45;
            dVar53 = dVar46 + dVar47;
            cc[(long)iVar1 + lVar34 + 2] = (dVar52 + dVar53) * dVar43;
            cc[(long)iVar1 + lVar36 + 2] = (dVar52 - dVar53) * dVar43;
            dVar46 = dVar46 - dVar47;
            dVar48 = dVar48 - dVar49;
            cc[iVar1 + lVar41] = (dVar46 + dVar48) * dVar43;
            cc[iVar1 + lVar30] = (dVar48 - dVar46) * dVar43;
            dVar44 = dVar44 - dVar45;
            dVar50 = dVar50 - dVar51;
            cc[(long)iVar1 + lVar28 + 2] = (dVar44 + dVar50) * dVar43;
            bVar16 = lVar20 <= iVar35;
            if (iVar8 < 0) {
              bVar16 = iVar10 < lVar20;
            }
            cc[(long)iVar1 + lVar39 + 2] = (dVar44 - dVar50) * dVar43;
            lVar20 = lVar20 + lVar27;
            iVar37 = iVar37 + iVar8 * 2;
          } while (bVar16);
        }
        lVar42 = lVar42 + 1;
        iVar18 = iVar18 + iVar5 * 2;
      } while (lVar42 != uVar25 + 1);
    }
  }
  else {
    iVar18 = uVar4 * 4 + 1;
    if (0 < (int)uVar6) {
      bVar17 = -1 < iVar10;
      if (iVar8 < 0) {
        bVar17 = iVar10 < 1;
      }
      iVar37 = (uVar40 + 1) * iVar5 * 2;
      iVar3 = ((uVar4 * 3 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar12 = ((uVar4 * 2 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar13 = ((iVar31 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar14 = (uVar6 * 8 + 1) * iVar7 * 2;
      iVar15 = (uVar6 * 6 + 1) * iVar7 * 2;
      iVar23 = (uVar6 * 7 + 1) * iVar7 * 2;
      iVar24 = (uVar11 + 1) * iVar7 * 2;
      lVar20 = 1;
      iVar22 = 0;
      iVar26 = 0;
      do {
        lVar38 = lVar27 + 1;
        iVar19 = iVar22;
        iVar32 = iVar26;
        if (bVar17) {
          do {
            dVar43 = cc[(long)iVar1 + (long)(iVar37 + 2 + iVar32) + 2] -
                     cc[(long)iVar1 + (long)(iVar3 + 2 + iVar32) + 2];
            dVar44 = cc[(long)iVar1 + (long)(iVar37 + 2 + iVar32) + 2] +
                     cc[(long)iVar1 + (long)(iVar3 + 2 + iVar32) + 2];
            dVar45 = cc[(long)iVar1 + (long)(iVar12 + 2 + iVar32) + 2] -
                     cc[(long)iVar1 + (long)(iVar13 + 2 + iVar32) + 2];
            dVar46 = cc[(long)iVar1 + (long)(iVar12 + 2 + iVar32) + 2] +
                     cc[(long)iVar1 + (long)(iVar13 + 2 + iVar32) + 2];
            dVar47 = cc[(long)iVar1 + (long)(iVar37 + 3 + iVar32)] -
                     cc[(long)iVar1 + (long)(iVar3 + 3 + iVar32)];
            dVar49 = cc[(long)iVar1 + (long)(iVar37 + 3 + iVar32)] +
                     cc[(long)iVar1 + (long)(iVar3 + 3 + iVar32)];
            dVar48 = cc[(long)iVar1 + (long)(iVar13 + 3 + iVar32)] -
                     cc[(long)iVar1 + (long)(iVar12 + 3 + iVar32)];
            dVar50 = cc[(long)iVar1 + (long)(iVar13 + 3 + iVar32)] +
                     cc[(long)iVar1 + (long)(iVar12 + 3 + iVar32)];
            ch[(long)iVar2 + (long)(iVar24 + 3 + iVar19)] = dVar49 + dVar50;
            ch[(long)iVar2 + (long)(iVar23 + 3 + iVar19)] = dVar49 - dVar50;
            ch[(long)iVar2 + (long)(iVar24 + 2 + iVar19) + 2] = dVar44 + dVar46;
            ch[(long)iVar2 + (long)(iVar23 + 2 + iVar19) + 2] = dVar44 - dVar46;
            ch[(long)iVar2 + (long)(iVar15 + 3 + iVar19)] = dVar45 + dVar47;
            ch[(long)iVar2 + (long)(iVar14 + 3 + iVar19)] = dVar47 - dVar45;
            ch[(long)iVar2 + (long)(iVar15 + 2 + iVar19) + 2] = dVar43 + dVar48;
            ch[(long)iVar2 + (long)(iVar14 + 2 + iVar19) + 2] = dVar43 - dVar48;
            bVar16 = lVar38 <= iVar35;
            if (iVar8 < 0) {
              bVar16 = lVar42 < lVar38;
            }
            iVar32 = iVar32 + iVar8 * 2;
            lVar38 = lVar38 + lVar27;
            iVar19 = iVar19 + iVar9 * 2;
          } while (bVar16);
        }
        lVar20 = lVar20 + 1;
        iVar26 = iVar26 + iVar5 * 2;
        iVar22 = iVar22 + iVar7 * 2;
      } while (lVar20 != uVar25 + 1);
    }
    bVar17 = -1 < iVar10;
    if (iVar8 < 0) {
      bVar17 = iVar10 < 1;
    }
    iVar3 = ((uVar4 + 2) * uVar6 + 1) * iVar5 * 2 + 3;
    iVar12 = ((uVar4 * 3 + 2) * uVar6 + 1) * iVar5 * 2;
    iVar13 = ((uVar4 * 2 + 2) * uVar6 + 1) * iVar5 * 2;
    iVar14 = ((iVar31 + 2) * uVar6 + 1) * iVar5 * 2;
    iVar37 = (uVar6 * 0xc + 1) * iVar7 * 2;
    iVar15 = (uVar6 * 0xb + 1) * iVar7 * 2;
    iVar23 = (uVar6 * 10 + 1) * iVar7 * 2;
    iVar24 = (uVar6 * 9 + 1) * iVar7 * 2;
    uVar25 = 2;
    local_c4 = 0;
    local_c8 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar21 = 1;
        local_144 = local_c8;
        iVar22 = local_c4;
        do {
          lVar42 = lVar27 + 1;
          iVar26 = local_144;
          iVar32 = iVar22;
          if (bVar17) {
            do {
              dVar45 = cc[(long)iVar1 + (long)(iVar3 + iVar26 + -1) + 2] +
                       cc[(long)iVar1 + (long)(iVar12 + 2 + iVar26) + 2];
              dVar46 = cc[(long)iVar1 + (long)(iVar13 + 2 + iVar26) + 2] -
                       cc[(long)iVar1 + (long)(iVar14 + 2 + iVar26) + 2];
              dVar43 = cc[(long)iVar1 + (long)(iVar3 + iVar26 + -1) + 2] -
                       cc[(long)iVar1 + (long)(iVar12 + 2 + iVar26) + 2];
              dVar47 = cc[(long)iVar1 + (long)(iVar26 + iVar3)] +
                       cc[(long)iVar1 + (long)(iVar12 + 3 + iVar26)];
              dVar49 = cc[(long)iVar1 + (long)(iVar13 + 2 + iVar26) + 2] +
                       cc[(long)iVar1 + (long)(iVar14 + 2 + iVar26) + 2];
              dVar44 = cc[(long)iVar1 + (long)(iVar26 + iVar3)] -
                       cc[(long)iVar1 + (long)(iVar12 + 3 + iVar26)];
              dVar50 = cc[(long)iVar1 + (long)(iVar14 + 3 + iVar26)] +
                       cc[(long)iVar1 + (long)(iVar13 + 3 + iVar26)];
              dVar48 = cc[(long)iVar1 + (long)(iVar14 + 3 + iVar26)] -
                       cc[(long)iVar1 + (long)(iVar13 + 3 + iVar26)];
              ch[(long)iVar2 + (long)(iVar24 + 3 + iVar32)] = dVar47 + dVar50;
              ch[(long)iVar2 + (long)(iVar24 + 2 + iVar32) + 2] = dVar45 + dVar49;
              dVar51 = dVar46 + dVar44;
              dVar52 = dVar43 + dVar48;
              ch[(long)iVar2 + (long)(iVar23 + 3 + iVar32)] =
                   wa[(long)-iVar18 + (long)iVar31 + uVar25] * dVar51 +
                   wa[(long)-iVar18 + uVar29 * 7 + uVar25] * dVar52;
              dVar47 = dVar47 - dVar50;
              dVar45 = dVar45 - dVar49;
              ch[(long)iVar2 + (long)(iVar23 + 2 + iVar32) + 2] =
                   dVar52 * wa[(long)-iVar18 + (long)iVar31 + uVar25] -
                   dVar51 * wa[(long)-iVar18 + uVar29 * 7 + uVar25];
              ch[(long)iVar2 + (long)(iVar15 + iVar32 + 3)] =
                   wa[(long)-iVar18 + uVar29 * 5 + uVar25] * dVar47 +
                   wa[(long)-iVar18 + (long)(int)(uVar4 * 8) + uVar25] * dVar45;
              dVar44 = dVar44 - dVar46;
              dVar43 = dVar43 - dVar48;
              ch[(long)iVar2 + (long)(iVar15 + 2 + iVar32) + 2] =
                   dVar45 * wa[(long)-iVar18 + uVar29 * 5 + uVar25] -
                   dVar47 * wa[(long)-iVar18 + (long)(int)(uVar4 * 8) + uVar25];
              ch[(long)iVar2 + (long)(iVar37 + 3 + iVar32)] =
                   wa[(long)-iVar18 + uVar29 * 6 + uVar25] * dVar44 +
                   wa[(long)-iVar18 + uVar29 * 9 + uVar25] * dVar43;
              bVar16 = lVar42 <= iVar35;
              if (iVar8 < 0) {
                bVar16 = iVar10 < lVar42;
              }
              ch[(long)iVar2 + (long)(iVar37 + 2 + iVar32) + 2] =
                   dVar43 * wa[(long)-iVar18 + uVar29 * 6 + uVar25] -
                   dVar44 * wa[(long)-iVar18 + uVar29 * 9 + uVar25];
              lVar42 = lVar42 + lVar27;
              iVar26 = iVar26 + iVar8 * 2;
              iVar32 = iVar32 + iVar9 * 2;
            } while (bVar16);
          }
          uVar21 = uVar21 + 1;
          local_144 = local_144 + iVar5 * 2;
          iVar22 = iVar22 + iVar7 * 2;
        } while (uVar21 != uVar6 + 1);
      }
      uVar25 = uVar25 + 1;
      local_c8 = local_c8 + iVar5 * uVar6 * 2;
      local_c4 = local_c4 + iVar7 * uVar6 * 8;
    } while (uVar25 != uVar4 + 1);
  }
  return 0;
}

Assistant:

int cmf4kf_(int *lot, int *ido, int *l1, int
	*na, fft_real_t *cc, int *im1, int *in1, fft_real_t *ch, int *im2,
	int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int cc_dim2, cc_dim3, cc_dim4, cc_offset, ch_dim2, ch_dim3, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2, i__3, i__4;

    /* Local variables */
     int i__, k, m1, m2;
     fft_real_t sn, ci2, ci3, ci4;
     int m1d;
     fft_real_t cr3, cr2, cr4, ti1, ti2, ti3, ti4;
     int m2s;
     fft_real_t tr1, tr2, tr3, tr4;


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + (wa_dim1 << 2);
    wa -= wa_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ido;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * 5));
    ch -= ch_offset;

    /* Function Body */
    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    if (*ido > 1) {
	goto L102;
    }
    sn = 1.0 / (fft_real_t) (*l1 << 2);
    if (*na == 1) {
	goto L106;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] = sn *
		     (tr2 + tr3);
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    sn * (tr2 - tr3);
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] = sn *
		     (ti2 + ti3);
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    sn * (ti2 - ti3);
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = sn * (tr1 + tr4);
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = sn * (tr1 - tr4);
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = sn * (ti1 + ti4);
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = sn * (ti1 - ti4);
/* L101: */
	}
    }
    return 0;
L106:
    i__3 = *l1;
    for (k = 1; k <= i__3; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__1 = *im1;
	for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
	    m2 += *im2;
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 1] = sn * (tr2 + tr3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = sn * (tr2 - tr3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 2] = sn * (ti2 + ti3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = sn * (ti2 - ti3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = sn * (tr1 + tr4)
		    ;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = sn * (tr1 -
		    tr4);
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = sn * (ti1 + ti4)
		    ;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = sn * (ti1 -
		    ti4);
/* L107: */
	}
    }
    return 0;
L102:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    m2 += *im2;
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 1] = tr2 + tr3;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = tr2 - tr3;
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 2] = ti2 + ti3;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = ti2 - ti3;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = tr1 + tr4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = tr1 - tr4;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = ti1 + ti4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = ti1 - ti4;
/* L103: */
	}
    }
    i__3 = *ido;
    for (i__ = 2; i__ <= i__3; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		ti1 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] - cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 2];
		ti2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 2];
		ti3 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] + cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 2];
		tr4 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] - cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 2];
		tr1 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] - cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 1];
		tr2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 1];
		ti4 = cc[(m1 + (k + (i__ + (cc_dim4 << 2)) * cc_dim3) *
			cc_dim2 << 1) + 1] - cc[(m1 + (k + (i__ + (cc_dim4 <<
			1)) * cc_dim3) * cc_dim2 << 1) + 1];
		tr3 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] + cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 1];
		ch[(m2 + (k + ((i__ << 2) + 1) * ch_dim3) * ch_dim2 << 1) + 1]
			 = tr2 + tr3;
		cr3 = tr2 - tr3;
		ch[(m2 + (k + ((i__ << 2) + 1) * ch_dim3) * ch_dim2 << 1) + 2]
			 = ti2 + ti3;
		ci3 = ti2 - ti3;
		cr2 = tr1 + tr4;
		cr4 = tr1 - tr4;
		ci2 = ti1 + ti4;
		ci4 = ti1 - ti4;
		ch[(m2 + (k + ((i__ << 2) + 2) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + (wa_dim1 << 2)] * cr2 + wa[i__ + wa_dim1 *
			 7] * ci2;
		ch[(m2 + (k + ((i__ << 2) + 2) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + (wa_dim1 << 2)] * ci2 - wa[i__ + wa_dim1 *
			 7] * cr2;
		ch[(m2 + (k + ((i__ << 2) + 3) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + wa_dim1 * 5] * cr3 + wa[i__ + (wa_dim1 <<
			3)] * ci3;
		ch[(m2 + (k + ((i__ << 2) + 3) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + wa_dim1 * 5] * ci3 - wa[i__ + (wa_dim1 <<
			3)] * cr3;
		ch[(m2 + (k + ((i__ << 2) + 4) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + wa_dim1 * 6] * cr4 + wa[i__ + wa_dim1 * 9]
			 * ci4;
		ch[(m2 + (k + ((i__ << 2) + 4) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + wa_dim1 * 6] * ci4 - wa[i__ + wa_dim1 * 9]
			 * cr4;
/* L104: */
	    }
	}
/* L105: */
    }
    return 0;
}